

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O0

void brotli::WriteHuffmanTree
               (uint8_t *depth,size_t length,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tree,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *extra_bits_data)

{
  uint8_t value_00;
  bool bVar1;
  ulong local_68;
  size_t k;
  size_t reps;
  ulong uStack_50;
  uint8_t value;
  size_t i_1;
  bool use_rle_for_zero;
  ulong uStack_40;
  bool use_rle_for_non_zero;
  size_t i;
  size_t new_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_28;
  uint8_t previous_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *extra_bits_data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *tree_local;
  size_t length_local;
  uint8_t *depth_local;
  
  new_length._7_1_ = '\b';
  uStack_40 = 0;
  i = length;
  while ((uStack_40 < length && (depth[(length - uStack_40) + -1] == '\0'))) {
    i = i - 1;
    uStack_40 = uStack_40 + 1;
  }
  i_1._7_1_ = 0;
  i_1._6_1_ = 0;
  pvStack_28 = extra_bits_data;
  extra_bits_data_local = tree;
  tree_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)length;
  length_local = (size_t)depth;
  if (0x32 < length) {
    DecideOverRleUse(depth,i,(bool *)((long)&i_1 + 7),(bool *)((long)&i_1 + 6));
  }
  for (uStack_50 = 0; uStack_50 < i; uStack_50 = k + uStack_50) {
    value_00 = *(uint8_t *)(length_local + uStack_50);
    k = 1;
    local_68 = uStack_50;
    if (((value_00 != '\0') && ((i_1._7_1_ & 1) != 0)) ||
       ((value_00 == '\0' && ((i_1._6_1_ & 1) != 0)))) {
      while( true ) {
        local_68 = local_68 + 1;
        bVar1 = false;
        if (local_68 < i) {
          bVar1 = *(uint8_t *)(length_local + local_68) == value_00;
        }
        if (!bVar1) break;
        k = k + 1;
      }
    }
    if (value_00 == '\0') {
      WriteHuffmanTreeRepetitionsZeros(k,extra_bits_data_local,pvStack_28);
    }
    else {
      WriteHuffmanTreeRepetitions(new_length._7_1_,value_00,k,extra_bits_data_local,pvStack_28);
      new_length._7_1_ = value_00;
    }
  }
  return;
}

Assistant:

void WriteHuffmanTree(const uint8_t* depth,
                      size_t length,
                      std::vector<uint8_t> *tree,
                      std::vector<uint8_t> *extra_bits_data) {
  uint8_t previous_value = 8;

  // Throw away trailing zeros.
  size_t new_length = length;
  for (size_t i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  // First gather statistics on if it is a good idea to do rle.
  bool use_rle_for_non_zero = false;
  bool use_rle_for_zero = false;
  if (length > 50) {
    // Find rle coding for longer codes.
    // Shorter codes seem not to benefit from rle.
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  // Actual rle coding.
  for (size_t i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      for (size_t k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      WriteHuffmanTreeRepetitionsZeros(reps, tree, extra_bits_data);
    } else {
      WriteHuffmanTreeRepetitions(previous_value,
                                  value, reps, tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}